

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shader.h
# Opt level: O3

bool __thiscall Diligent::ShaderCreateInfo::operator==(ShaderCreateInfo *this,ShaderCreateInfo *RHS)

{
  char *pcVar1;
  char *pcVar2;
  void *__s1;
  void *__s2;
  bool bVar3;
  int iVar4;
  
  pcVar1 = this->FilePath;
  pcVar2 = RHS->FilePath;
  if (((pcVar1 == (char *)0x0) != (pcVar2 != (char *)0x0)) &&
     ((pcVar1 == (char *)0x0 || pcVar2 == (char *)0x0 || (iVar4 = strcmp(pcVar1,pcVar2), iVar4 == 0)
      ))) {
    pcVar1 = this->Source;
    pcVar2 = RHS->Source;
    if (((pcVar1 == (char *)0x0) != (pcVar2 != (char *)0x0)) &&
       (((pcVar1 == (char *)0x0 || pcVar2 == (char *)0x0 ||
         (iVar4 = strcmp(pcVar1,pcVar2), iVar4 == 0)) &&
        ((this->field_4).SourceLength == (RHS->field_4).SourceLength)))) {
      __s1 = this->ByteCode;
      __s2 = RHS->ByteCode;
      if (((__s2 != (void *)0x0) == (__s1 != (void *)0x0)) &&
         ((__s1 == (void *)0x0 || __s2 == (void *)0x0 ||
          (iVar4 = bcmp(__s1,__s2,(this->field_4).SourceLength), iVar4 == 0)))) {
        pcVar1 = this->EntryPoint;
        pcVar2 = RHS->EntryPoint;
        if (((pcVar1 == (char *)0x0) != (pcVar2 != (char *)0x0)) &&
           (((pcVar1 == (char *)0x0 || pcVar2 == (char *)0x0 ||
             (iVar4 = strcmp(pcVar1,pcVar2), iVar4 == 0)) &&
            ((bVar3 = ShaderMacroArray::operator==(&this->Macros,&RHS->Macros), bVar3 &&
             (((bVar3 = ShaderDesc::operator==(&this->Desc,&RHS->Desc), bVar3 &&
               (this->SourceLanguage == RHS->SourceLanguage)) &&
              (this->ShaderCompiler == RHS->ShaderCompiler)))))))) {
          if ((this->HLSLVersion).Major != (RHS->HLSLVersion).Major) {
            return false;
          }
          if ((this->HLSLVersion).Minor != (RHS->HLSLVersion).Minor) {
            return false;
          }
          if ((this->GLSLVersion).Major != (RHS->GLSLVersion).Major) {
            return false;
          }
          if ((this->GLSLVersion).Minor != (RHS->GLSLVersion).Minor) {
            return false;
          }
          if ((this->GLESSLVersion).Major != (RHS->GLESSLVersion).Major) {
            return false;
          }
          if ((this->GLESSLVersion).Minor != (RHS->GLESSLVersion).Minor) {
            return false;
          }
          if ((this->MSLVersion).Major != (RHS->MSLVersion).Major) {
            return false;
          }
          if ((this->MSLVersion).Minor != (RHS->MSLVersion).Minor) {
            return false;
          }
          if ((this->CompileFlags == RHS->CompileFlags) &&
             (this->LoadConstantBufferReflection == RHS->LoadConstantBufferReflection)) {
            pcVar1 = this->GLSLExtensions;
            pcVar2 = RHS->GLSLExtensions;
            if (((pcVar1 == (char *)0x0) != (pcVar2 != (char *)0x0)) &&
               ((pcVar1 == (char *)0x0 || pcVar2 == (char *)0x0 ||
                (iVar4 = strcmp(pcVar1,pcVar2), iVar4 == 0)))) {
              pcVar1 = this->WebGPUEmulatedArrayIndexSuffix;
              pcVar2 = RHS->WebGPUEmulatedArrayIndexSuffix;
              if ((pcVar1 == (char *)0x0) != (pcVar2 != (char *)0x0)) {
                if (pcVar1 == (char *)0x0 || pcVar2 == (char *)0x0) {
                  return true;
                }
                iVar4 = strcmp(pcVar1,pcVar2);
                return iVar4 == 0;
              }
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool operator==(const ShaderCreateInfo& RHS) const noexcept
    {
        const auto& CI1 = *this;
        const auto& CI2 = RHS;

        if (!SafeStrEqual(CI1.FilePath, CI2.FilePath))
            return false;

        //if (CI1.FilePath != nullptr && CI1.pShaderSourceStreamFactory != CI2.pShaderSourceStreamFactory)
        //    return false;

        if (!SafeStrEqual(CI1.Source, CI2.Source))
            return false;

        if (CI1.SourceLength != CI2.SourceLength)
            return false;

        if ((CI1.ByteCode != nullptr) != (CI2.ByteCode != nullptr))
            return false;

        if ((CI1.ByteCode != nullptr) && (CI2.ByteCode != nullptr))
        {
            if (memcmp(CI1.ByteCode, CI2.ByteCode, CI1.ByteCodeSize) != 0)
                return false;
        }

        if (!SafeStrEqual(CI1.EntryPoint, CI2.EntryPoint))
            return false;

        if (CI1.Macros != CI2.Macros)
            return false;

        if (CI1.Desc != CI2.Desc)
            return false;

        if (CI1.SourceLanguage != CI2.SourceLanguage)
            return false;

        if (CI1.ShaderCompiler != CI2.ShaderCompiler)
            return false;

        if ((CI1.HLSLVersion != CI2.HLSLVersion ||
             CI1.GLSLVersion != CI2.GLSLVersion ||
             CI1.GLESSLVersion != CI2.GLESSLVersion ||
             CI1.MSLVersion != CI2.MSLVersion))
            return false;

        if (CI1.CompileFlags != CI2.CompileFlags)
            return false;

        if (CI1.LoadConstantBufferReflection != CI2.LoadConstantBufferReflection)
            return false;

        if (!SafeStrEqual(CI1.GLSLExtensions, CI2.GLSLExtensions))
            return false;

        if (!SafeStrEqual(CI1.WebGPUEmulatedArrayIndexSuffix, CI2.WebGPUEmulatedArrayIndexSuffix))
            return false;

        return true;
    }